

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  bool bVar1;
  float *pfVar2;
  long *in_RSI;
  long in_RDI;
  Mat *this_00;
  float top_blob_int8_scale;
  float bottom_blob_int8_scale_1;
  float weight_data_int8_scale;
  float bottom_blob_int8_scale;
  Allocator *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  Mat *m;
  Mat *in_stack_fffffffffffffc08;
  float _v;
  Mat *in_stack_fffffffffffffc10;
  Mat *this_01;
  Mat local_360;
  float local_314;
  undefined1 local_310 [148];
  float local_27c;
  float local_22c;
  undefined1 local_228 [72];
  undefined1 local_1e0 [148];
  float local_14c;
  undefined1 local_148 [72];
  undefined1 local_100 [72];
  undefined1 local_b8 [88];
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0x160) == 0) {
    local_18 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,*(undefined4 *)(in_RDI + 0x104),0);
    ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    ncnn::Mat::~Mat((Mat *)0x60cd0c);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc00);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0x100) != 0) {
        (**(code **)(*local_18 + 0x10))(local_b8,local_18,*(undefined4 *)(in_RDI + 0xd0),1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60cdd0);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffc00);
        if (bVar1) {
          return -100;
        }
      }
      if ((*(int *)(in_RDI + 0x10c) == 1) || (*(int *)(in_RDI + 0x10c) == 0x65)) {
        (**(code **)(*local_18 + 0x10))(local_100,local_18,*(undefined4 *)(in_RDI + 0x108),1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60cea7);
        (**(code **)(*local_18 + 0x10))(local_148,local_18,1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60cefa);
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x240),0);
        local_14c = *pfVar2;
        ncnn::Mat::Mat(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (size_t)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60cf74);
        ncnn::Mat::fill(in_stack_fffffffffffffc10,(float)((ulong)in_stack_fffffffffffffc08 >> 0x20))
        ;
      }
      else if ((*(int *)(in_RDI + 0x10c) == 2) || (*(int *)(in_RDI + 0x10c) == 0x66)) {
        (**(code **)(*local_18 + 0x10))(local_1e0,local_18,1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60d07b);
        (**(code **)(*local_18 + 0x10))(local_228,local_18,1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60d0c8);
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x1f8),0);
        local_22c = *pfVar2;
        ncnn::Mat::Mat(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (size_t)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60d142);
        ncnn::Mat::fill(in_stack_fffffffffffffc10,(float)((ulong)in_stack_fffffffffffffc08 >> 0x20))
        ;
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x240),0);
        local_27c = *pfVar2;
        ncnn::Mat::Mat(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                       (size_t)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60d1d9);
        ncnn::Mat::fill(in_stack_fffffffffffffc10,(float)((ulong)in_stack_fffffffffffffc08 >> 0x20))
        ;
      }
      if (100 < *(int *)(in_RDI + 0x10c)) {
        (**(code **)(*local_18 + 0x10))(local_310,local_18,1);
        ncnn::Mat::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
        ncnn::Mat::~Mat((Mat *)0x60d2f7);
        this_00 = (Mat *)(in_RDI + 0x288);
        m = (Mat *)0x0;
        pfVar2 = ncnn::Mat::operator[](this_00,0);
        local_314 = *pfVar2;
        this_01 = &local_360;
        ncnn::Mat::Mat(this_01,(int)((ulong)this_00 >> 0x20),(size_t)m,in_stack_fffffffffffffbf8);
        ncnn::Mat::operator=(this_00,m);
        _v = (float)((ulong)this_00 >> 0x20);
        ncnn::Mat::~Mat((Mat *)0x60d371);
        ncnn::Mat::fill(this_01,_v);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

    return 0;
}